

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1449a52::TargetCompileOptionsImpl::HandleDirectContent
          (TargetCompileOptionsImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PolicyStatus PVar2;
  cmListFileBacktrace lfbt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58;
  
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmTargetPropCommandBase).Makefile,CMP0101,false);
  cmMakefile::GetBacktrace((this->super_cmTargetPropCommandBase).Makefile);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(&local_88,this,content);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  paVar1 = &local_58.Value.field_2;
  if (local_88 == &local_78) {
    local_58.Value.field_2._8_8_ = local_78._8_8_;
    local_58.Value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58.Value._M_dataplus._M_p = (pointer)local_88;
  }
  local_58.Value.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
  local_58.Value.field_2._M_local_buf[0] = local_78._M_local_buf[0];
  local_58.Value._M_string_length = local_80;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_68;
  local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_60;
  local_88 = &local_78;
  cmTarget::InsertCompileOption(tgt,&local_58,WARN < PVar2 && prepend);
  if (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.Value._M_dataplus._M_p,local_58.Value.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0])
                             + 1);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool prepend, bool /*system*/) override
  {
    cmPolicies::PolicyStatus policyStatus =
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0101);
    if (policyStatus == cmPolicies::OLD || policyStatus == cmPolicies::WARN) {
      prepend = false;
    }

    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    tgt->InsertCompileOption(BT<std::string>(this->Join(content), lfbt),
                             prepend);
    return true; // Successfully handled.
  }